

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitAssignmentToDefaultModuleExport
          (ByteCodeGenerator *this,ParseNode *pnode,FuncInfo *funcInfo)

{
  uint moduleId;
  JavascriptLibrary *this_00;
  uint slotId2;
  SourceTextModuleRecord *this_01;
  
  moduleId = ((this->m_utf8SourceInfo->m_srcInfo).ptr)->moduleID;
  this_00 = (this->scriptContext->super_ScriptContextBase).javascriptLibrary;
  Js::JavascriptLibrary::EnsureModuleRecordList(this_00);
  this_01 = Js::JavascriptLibrary::GetModuleRecord(this_00,moduleId);
  slotId2 = Js::SourceTextModuleRecord::GetLocalExportSlotIndexByExportName(this_01,0x6e);
  Js::ByteCodeWriter::SlotI2(&this->m_writer,StModuleSlot,pnode->location,moduleId,slotId2);
  return;
}

Assistant:

void ByteCodeGenerator::EmitAssignmentToDefaultModuleExport(ParseNode* pnode, FuncInfo* funcInfo)
{
    // We are assigning pnode to the default export of the current module.
    uint moduleIndex = this->GetModuleID();

    Js::JavascriptLibrary* library = this->GetScriptContext()->GetLibrary();
    library->EnsureModuleRecordList();
    Js::SourceTextModuleRecord* moduleRecord = library->GetModuleRecord(moduleIndex);
    uint moduleSlotIndex = moduleRecord->GetLocalExportSlotIndexByExportName(Js::PropertyIds::default_);

    this->Writer()->SlotI2(Js::OpCode::StModuleSlot, pnode->location, moduleIndex, moduleSlotIndex);
}